

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one_valus_inst.c
# Opt level: O2

void i64Clz_op(vm *v,instruction *inst)

{
  ulong uVar1;
  uint64 val;
  
  uVar1 = popU64(&v->operandStack);
  val = 0x40;
  for (; uVar1 != 0; uVar1 = uVar1 >> 1) {
    val = val - 1;
  }
  pushU64(&v->operandStack,val);
  return;
}

Assistant:

void i64Clz_op(vm *v, instruction *inst) {
    stack *s = &v->operandStack;
    uint64 val = popU64(s);
    uint64 count = sizeof(uint64) * 8;
    while (val != 0) {
        val >>= 1;
        count--;
    }
    pushU64(s, count);
}